

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# maxsender.h
# Opt level: O2

void quicly_maxsender_record(quicly_maxsender_t *m,int64_t value,quicly_maxsender_sent_t *sent)

{
  if (m->max_committed <= value) {
    m->max_committed = value;
    m->num_inflight = m->num_inflight + 1;
    m->field_0x18 = m->field_0x18 & 0xfe;
    *sent = (quicly_maxsender_sent_t)(value * 2 + 1);
    return;
  }
  __assert_fail("value >= m->max_committed",
                "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/include/quicly/maxsender.h"
                ,0x69,
                "void quicly_maxsender_record(quicly_maxsender_t *, int64_t, quicly_maxsender_sent_t *)"
               );
}

Assistant:

inline void quicly_maxsender_record(quicly_maxsender_t *m, int64_t value, quicly_maxsender_sent_t *sent)
{
    assert(value >= m->max_committed);
    m->max_committed = value;
    ++m->num_inflight;
    m->force_send = 0;
    sent->inflight = 1;
    sent->value = value;
}